

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

Status __thiscall
leveldb::StringSource::Read(StringSource *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  ulong uVar1;
  void *in_R9;
  Slice *__n;
  Slice local_40;
  Slice local_30;
  
  uVar1 = *(ulong *)(offset + 0x10);
  if (uVar1 < n || (Slice *)(uVar1 - n) == (Slice *)0x0) {
    local_30.data_ = "invalid Read offset";
    local_30.size_ = 0x13;
    local_40.data_ = "";
    local_40.size_ = 0;
    Status::Status((Status *)this,kInvalidArgument,&local_30,&local_40);
  }
  else {
    __n = (Slice *)(uVar1 - n);
    if ((long)&result->data_ + n <= uVar1) {
      __n = result;
    }
    memcpy(in_R9,(void *)(n + *(long *)(offset + 8)),(size_t)__n);
    *(void **)scratch = in_R9;
    *(Slice **)(scratch + 8) = __n;
    (this->super_RandomAccessFile)._vptr_RandomAccessFile = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    if (offset >= contents_.size()) {
      return Status::InvalidArgument("invalid Read offset");
    }
    if (offset + n > contents_.size()) {
      n = contents_.size() - offset;
    }
    std::memcpy(scratch, &contents_[offset], n);
    *result = Slice(scratch, n);
    return Status::OK();
  }